

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_dup(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t options,ly_bool nosiblings,
              lyd_node **dup_p)

{
  lysc_node *schema2;
  lysc_node *plVar1;
  uint32_t uVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  lysc_node **pplVar7;
  lysc_node **pplVar8;
  lyd_node *siblings;
  undefined7 in_register_00000081;
  byte bVar9;
  lyd_node *plVar10;
  lyd_node_inner *node2;
  lyd_node *plVar11;
  bool bVar12;
  lyd_node *iter;
  lyd_node *dup;
  lyd_node *first_sibling;
  lyd_node *local_80;
  lyd_node *local_78;
  lyd_node *local_70;
  lyd_node *local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  uint local_50;
  undefined4 local_4c;
  lys_module *local_48;
  lyd_node *local_40;
  lyd_node **local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000081,nosiblings);
  local_68 = (lyd_node *)0x0;
  local_40 = (lyd_node *)0x0;
  local_60 = trg_ctx;
  local_38 = dup_p;
  if (trg_ctx == (ly_ctx *)0x0) {
    __assert_fail("node && trg_ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x8e1,
                  "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                 );
  }
  if ((options & 4) == 0) {
    local_70 = (lyd_node *)0x0;
  }
  else {
    local_78 = (lyd_node *)0x0;
    if (node == (lyd_node *)0x0) {
      node2 = (lyd_node_inner *)0x0;
    }
    else {
      node2 = node->parent;
    }
    local_58 = trg_ctx;
    if (node2 == (lyd_node_inner *)0x0) {
      bVar12 = true;
      local_70 = (lyd_node *)0x0;
      local_80 = (lyd_node *)0x0;
    }
    else {
      local_50 = options & 10;
      bVar9 = (byte)node->flags >> 3 & 1;
      local_48 = (lys_module *)&parent[2].schema;
      bVar12 = true;
      local_70 = (lyd_node *)0x0;
      local_80 = (lyd_node *)0x0;
      do {
        if (bVar9 != 0) {
          plVar1 = (node2->field_0).node.schema;
          if (plVar1 == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&node2[1].field_0.node.priv;
          }
          else {
            plVar5 = plVar1->module;
          }
          local_58 = plVar5->ctx;
        }
        if (parent == (lyd_node *)0x0) {
LAB_001226f8:
          local_78 = (lyd_node *)0x0;
          LVar4 = lyd_dup_r((lyd_node *)node2,local_58,(lyd_node *)0x0,0,&local_78,local_50,
                            &local_78);
          if (LVar4 != LY_SUCCESS) goto LAB_0012282e;
          if (local_70 != (lyd_node *)0x0) {
            lyd_insert_node(local_78,(lyd_node **)0x0,local_70,0);
          }
          local_70 = local_78;
        }
        else {
          plVar1 = parent->schema;
          plVar5 = local_48;
          if (plVar1 != (lysc_node *)0x0) {
            plVar5 = plVar1->module;
          }
          schema2 = (node2->field_0).node.schema;
          if (schema2 == (lysc_node *)0x0) {
            plVar6 = (lys_module *)((long)&node2[1].field_0 + 0x30);
          }
          else {
            plVar6 = schema2->module;
          }
          if ((plVar1 != schema2) || (plVar5->ctx != plVar6->ctx)) {
            plVar5 = local_48;
            if (plVar1 != (lysc_node *)0x0) {
              plVar5 = plVar1->module;
            }
            if (schema2 == (lysc_node *)0x0) {
              plVar6 = (lys_module *)((long)&node2[1].field_0 + 0x30);
            }
            else {
              plVar6 = schema2->module;
            }
            if (((plVar5->ctx == plVar6->ctx) ||
                (lVar3 = lyd_compare_schema_equal(plVar1,schema2), lVar3 == '\0')) ||
               (lVar3 = lyd_compare_schema_parents_equal(parent,(lyd_node *)node2), lVar3 == '\0'))
            goto LAB_001226f8;
          }
          bVar12 = false;
          local_78 = parent;
        }
        if (local_80 == (lyd_node *)0x0) {
          local_80 = local_78;
        }
        if ((undefined1  [56])((undefined1  [56])node2->field_0 & (undefined1  [56])0x800000000) !=
            (undefined1  [56])0x0) {
          bVar9 = 1;
        }
      } while ((bVar12) && (node2 = (node2->field_0).node.parent, node2 != (lyd_node_inner *)0x0));
    }
    if ((bool)(bVar12 ^ 1U | parent == (lyd_node *)0x0)) {
      LVar4 = LY_SUCCESS;
      if (local_70 != (lyd_node *)0x0 && parent != (lyd_node *)0x0) {
        LVar4 = LY_SUCCESS;
        lyd_insert_node(parent,(lyd_node **)0x0,local_70,0);
      }
    }
    else {
      pplVar7 = (lysc_node **)&node->schema->name;
      if (node->schema == (lysc_node *)0x0) {
        pplVar7 = &node[1].schema;
      }
      pplVar8 = &parent[1].schema;
      if (parent->schema != (lysc_node *)0x0) {
        pplVar8 = (lysc_node **)&parent->schema->name;
      }
      LVar4 = LY_EINVAL;
      ly_log(local_58,LY_LLERR,LY_EINVAL,
             "None of the duplicated node \"%s\" schema parents match the provided parent \"%s\".",
             *pplVar7,*pplVar8);
    }
LAB_0012282e:
    parent = local_80;
    if (LVar4 != LY_SUCCESS) {
      plVar11 = (lyd_node *)0x0;
LAB_00122996:
      if (local_70 != (lyd_node *)0x0) {
        lyd_free_tree(local_70);
        return LVar4;
      }
      plVar10 = local_68;
      if (plVar11 != (lyd_node *)0x0) {
        plVar10 = plVar11;
      }
      lyd_free_siblings(plVar10);
      return LVar4;
    }
  }
  if (node == (lyd_node *)0x0) {
    plVar11 = (lyd_node *)0x0;
  }
  else {
    local_80._0_4_ = options >> 5 & 2;
    plVar10 = (lyd_node *)0x0;
    plVar11 = (lyd_node *)0x0;
    do {
      plVar1 = node->schema;
      if (((plVar1 == (lysc_node *)0x0) || (plVar1->nodetype != 4)) ||
         ((plVar1->flags & 0x100) == 0)) {
        uVar2 = (uint)local_80;
        if (plVar10 == (lyd_node *)0x0) {
          if (plVar1 == (lysc_node *)0x0) {
            plVar10 = (lyd_node *)0x0;
          }
          else {
            plVar10 = node;
            if ((plVar1->nodetype & 0x18) == 0) {
              plVar10 = (lyd_node *)0x0;
            }
          }
        }
        else {
          bVar12 = plVar1 != plVar10->schema;
          if (bVar12) {
            plVar10 = (lyd_node *)0x0;
          }
          if (!bVar12) {
            uVar2 = 1;
          }
        }
        LVar4 = lyd_dup_r(node,local_60,parent,uVar2,&local_40,options,&local_68);
        if (LVar4 != LY_SUCCESS) goto LAB_00122996;
        if (plVar10 == (lyd_node *)0x0) {
          plVar10 = (lyd_node *)0x0;
        }
        else if (local_68->next != (lyd_node *)0x0) {
          plVar10 = (lyd_node *)0x0;
        }
      }
      else if (parent == (lyd_node *)0x0) {
        if ((options & 4) != 0) {
          __assert_fail("!(options & LYD_DUP_WITH_PARENTS)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                        ,0x8f1,
                        "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                       );
        }
        LVar4 = lyd_dup_r(node,local_60,(lyd_node *)0x0,0,&local_40,options,&local_68);
        if (LVar4 != LY_SUCCESS) goto LAB_00122996;
      }
      else {
        if ((parent->schema == (lysc_node *)0x0) || ((parent->schema->nodetype & 0x711) != 0)) {
          siblings = *(lyd_node **)(parent + 1);
        }
        else {
          siblings = (lyd_node *)0x0;
        }
        LVar4 = lyd_find_sibling_schema(siblings,plVar1,&local_68);
        if (LVar4 != LY_SUCCESS) {
          ly_log(local_60,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                 ,0x8ef);
          goto LAB_00122996;
        }
      }
      if (plVar11 == (lyd_node *)0x0) {
        plVar11 = local_68;
      }
    } while (((char)local_4c == '\0') && (node = node->next, node != (lyd_node *)0x0));
  }
  if (local_38 != (lyd_node **)0x0) {
    *local_38 = plVar11;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_dup(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t options,
        ly_bool nosiblings, struct lyd_node **dup_p)
{
    LY_ERR rc;
    const struct lyd_node *orig;            /* original node to be duplicated */
    struct lyd_node *first_dup = NULL;      /* the first duplicated node, this is returned */
    struct lyd_node *top = NULL;            /* the most higher created node */
    struct lyd_node *local_parent = NULL;   /* the direct parent node for the duplicated node(s) */
    struct lyd_node *dup = NULL;            /* duplicate node */
    struct lyd_node *first_sibling = NULL;  /* first sibling node */
    const struct lyd_node *first_llist = NULL;  /* first duplicated (leaf-)list node, if any */
    uint32_t insert_order;

    assert(node && trg_ctx);

    if (options & LYD_DUP_WITH_PARENTS) {
        LY_CHECK_GOTO(rc = lyd_dup_get_local_parent(node, trg_ctx, parent, options & (LYD_DUP_WITH_FLAGS | LYD_DUP_NO_META),
                &top, &local_parent), error);
    } else {
        local_parent = parent;
    }

    LY_LIST_FOR(node, orig) {
        if (lysc_is_key(orig->schema)) {
            if (local_parent) {
                /* the key must already exist in the parent */
                rc = lyd_find_sibling_schema(lyd_child(local_parent), orig->schema, &dup);
                LY_CHECK_ERR_GOTO(rc, LOGINT(trg_ctx), error);
            } else {
                assert(!(options & LYD_DUP_WITH_PARENTS));
                /* duplicating a single key, okay, I suppose... */
                rc = lyd_dup_r(orig, trg_ctx, NULL, LYD_INSERT_NODE_DEFAULT, &first_sibling, options, &dup);
                LY_CHECK_GOTO(rc, error);
            }
        } else {
            /* decide insert order */
            insert_order = (options & LYD_DUP_NO_LYDS) ? LYD_INSERT_NODE_LAST_BY_SCHEMA : LYD_INSERT_NODE_DEFAULT;
            if (first_llist) {
                if (orig->schema != first_llist->schema) {
                    /* all the (leaf-)list instances duplicated */
                    first_llist = NULL;
                } else {
                    /* duplicating all the instances of a (leaf-)list, no need to change their order */
                    insert_order = LYD_INSERT_NODE_LAST;
                }
            } else if (orig->schema && (orig->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
                /* duplicating the first (leaf-)list instance, duplicate the rest more efficiently */
                first_llist = orig;
            }

            /* duplicate the node */
            rc = lyd_dup_r(orig, trg_ctx, local_parent, insert_order, &first_sibling, options, &dup);
            LY_CHECK_GOTO(rc, error);

            if (first_llist && dup->next) {
                /* orig was not the last node (because we are inserting into a parent with some previous instances),
                 * we must check find the order */
                first_llist = NULL;
            }
        }
        first_dup = first_dup ? first_dup : dup;

        if (nosiblings) {
            break;
        }
    }

    if (dup_p) {
        *dup_p = first_dup;
    }
    return LY_SUCCESS;

error:
    if (top) {
        lyd_free_tree(top);
    } else if (first_dup) {
        lyd_free_siblings(first_dup);
    } else {
        lyd_free_siblings(dup);
    }
    return rc;
}